

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall
VulkanHppGenerator::checkStructMemberCorrectness
          (VulkanHppGenerator *this,string *structureName,
          vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
          *members,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *sTypeValues)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  pointer pMVar4;
  pointer ppVar5;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_> *this_00;
  reference pMVar6;
  _Base_ptr this_01;
  pointer ppVar7;
  pointer ppVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  bool local_686;
  byte local_661;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  _Base_ptr local_400;
  byte local_3f8;
  _Base_ptr local_3f0;
  byte local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  _Self local_2e0;
  _Self local_2d8;
  const_iterator enumIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  _Self local_290;
  _Self local_288;
  const_iterator typeIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arraySize;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *selection;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  MemberData *unionMember;
  const_iterator __end3;
  const_iterator __begin3;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_> *__range3;
  _Self local_118;
  const_iterator unionIt;
  _Self local_108;
  const_iterator selectorEnumIt;
  __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
  local_f8;
  const_iterator selectorIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Self local_60;
  _Self local_58;
  const_iterator memberTypeIt;
  MemberData *member;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_> *__range1;
  bool structUsed;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sTypeValues_local;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
  *members_local;
  string *structureName_local;
  VulkanHppGenerator *this_local;
  
  bVar2 = isTypeUsed(this,structureName);
  __end1 = std::
           vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>::
           begin(members);
  member = (MemberData *)
           std::
           vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>::
           end(members);
  do {
    bVar3 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                      (&__end1,(__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                                *)&member);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return;
    }
    memberTypeIt._M_node =
         (_Base_ptr)
         __gnu_cxx::
         __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
         ::operator*(&__end1);
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            starts_with(&(((reference)memberTypeIt._M_node)->type).type,"Vk");
    if (bVar3) {
      local_58._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
           ::find(&this->m_types,memberTypeIt._M_node + 2);
      local_60._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
           ::end(&this->m_types);
      bVar3 = std::operator==(&local_58,&local_60);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        __assert_fail("memberTypeIt != m_types.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x4ea,
                      "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                     );
      }
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>
               ::operator->(&local_58);
      bVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&(ppVar7->second).requiredBy);
      iVar1 = *(int *)&memberTypeIt._M_node[0xc]._M_left;
      std::operator+(&local_e0,"struct member type <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (memberTypeIt._M_node + 2));
      std::operator+(&local_c0,&local_e0,"> used in struct <");
      std::operator+(&local_a0,&local_c0,structureName);
      std::operator+(&local_80,&local_a0,"> is never required for any feature or extension");
      checkForError(!bVar3,iVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &memberTypeIt._M_node[10]._M_left);
    if (!bVar3) {
      local_f8._M_current =
           (MemberData *)
           findStructMemberIt(this,(string *)&memberTypeIt._M_node[10]._M_left,members);
      selectorEnumIt._M_node =
           (_Base_ptr)
           std::
           vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>::
           end(members);
      bVar3 = __gnu_cxx::
              operator==<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                        (&local_f8,
                         (__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                          *)&selectorEnumIt);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        __assert_fail("selectorIt != members.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x4f5,
                      "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                     );
      }
      pMVar4 = __gnu_cxx::
               __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
               ::operator->(&local_f8);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
           ::find(&this->m_enums,&(pMVar4->type).type);
      unionIt._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
           ::end(&this->m_enums);
      bVar3 = std::operator==(&local_108,(_Self *)&unionIt);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        __assert_fail("selectorEnumIt != m_enums.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x4f7,
                      "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                     );
      }
      local_118._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
           ::find(&this->m_structs,memberTypeIt._M_node + 2);
      __range3 = (vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                    ::end(&this->m_structs);
      bVar3 = std::operator==(&local_118,(_Self *)&__range3);
      local_661 = 0;
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
                 ::operator->(&local_118);
        local_661 = (ppVar5->second).isUnion;
      }
      if ((local_661 & 1) == 0) {
        __assert_fail("( unionIt != m_structs.end() ) && unionIt->second.isUnion",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x4f9,
                      "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                     );
      }
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
               ::operator->(&local_118);
      this_00 = &(ppVar5->second).members;
      __end3 = std::
               vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
               ::begin(this_00);
      unionMember = (MemberData *)
                    std::
                    vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                    ::end(this_00);
      while (bVar3 = __gnu_cxx::
                     operator==<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                               (&__end3,(__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                                         *)&unionMember), ((bVar3 ^ 0xffU) & 1) != 0) {
        pMVar6 = __gnu_cxx::
                 __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                 ::operator*(&__end3);
        bVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&pMVar6->selection);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          __assert_fail("!unionMember.selection.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4fd,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        __end4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&pMVar6->selection);
        selection = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(&pMVar6->selection);
        while (bVar3 = __gnu_cxx::
                       operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&selection), ((bVar3 ^ 0xffU) & 1) != 0) {
          local_160 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end4);
          ppVar8 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>
                   ::operator->(&local_108);
          bVar3 = contains(this,&(ppVar8->second).values,local_160);
          iVar1 = pMVar6->xmlLine;
          std::operator+(&local_220,"union member <",&pMVar6->name);
          std::operator+(&local_200,&local_220,"> uses selection <");
          std::operator+(&local_1e0,&local_200,local_160);
          std::operator+(&local_1c0,&local_1e0,"> that is not part of the selector type <");
          pMVar4 = __gnu_cxx::
                   __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                   ::operator->(&local_f8);
          std::operator+(&local_1a0,&local_1c0,&(pMVar4->type).type);
          std::operator+(&local_180,&local_1a0,">");
          checkForError(bVar3,iVar1,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_220);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
        __gnu_cxx::
        __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
        ::operator++(&__end3);
      }
    }
    bVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
            ::contains(&this->m_types,(key_type *)(memberTypeIt._M_node + 2));
    iVar1 = *(int *)&memberTypeIt._M_node[0xc]._M_left;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   "struct member uses unknown type <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (memberTypeIt._M_node + 2));
    std::operator+(&local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   ">");
    checkForError(bVar3,iVar1,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&__range2);
    this_01 = memberTypeIt._M_node + 5;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_01);
    arraySize = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_01);
    while (bVar3 = __gnu_cxx::
                   operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arraySize), ((bVar3 ^ 0xffU) & 1) != 0) {
      typeIt._M_node =
           (_Base_ptr)
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      bVar3 = isNumber((string *)typeIt._M_node);
      if ((!bVar3) &&
         (bVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                  ::contains(&this->m_constants,(key_type *)typeIt._M_node), !bVar3)) {
        local_288._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
             ::find(&this->m_types,typeIt._M_node);
        local_290._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
             ::end(&this->m_types);
        bVar3 = std::operator==(&local_288,&local_290);
        local_686 = false;
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          bVar3 = anon_unknown.dwarf_b1723::isAllUpper((string *)typeIt._M_node);
          local_686 = false;
          if (bVar3) {
            ppVar7 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>
                     ::operator->(&local_288);
            local_686 = (ppVar7->second).category == ExternalType;
          }
        }
        iVar1 = *(int *)&memberTypeIt._M_node[0xc]._M_left;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enumIt,
                       "struct member array size uses unknown constant <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       typeIt._M_node);
        std::operator+(&local_2b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enumIt,
                       ">");
        checkForError(local_686,iVar1,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&enumIt);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &memberTypeIt._M_node[0xb]._M_left);
    if (!bVar3) {
      local_2d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
           ::find(&this->m_enums,memberTypeIt._M_node + 2);
      local_2e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
           ::end(&this->m_enums);
      bVar3 = std::operator==(&local_2d8,&local_2e0);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(memberTypeIt._M_node + 2),"uint32_t");
        if (bVar3) {
          bVar3 = isNumber((string *)&memberTypeIt._M_node[0xb]._M_left);
          iVar1 = *(int *)&memberTypeIt._M_node[0xc]._M_left;
          std::operator+(&local_540,"value <",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &memberTypeIt._M_node[0xb]._M_left);
          std::operator+(&local_520,&local_540,"> for member <");
          std::operator+(&local_500,&local_520,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (memberTypeIt._M_node + 4));
          std::operator+(&local_4e0,&local_500,"> in structure <");
          std::operator+(&local_4c0,&local_4e0,structureName);
          std::operator+(&local_4a0,&local_4c0,"> of type <");
          std::operator+(&local_480,&local_4a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (memberTypeIt._M_node + 2));
          std::operator+(&local_460,&local_480,"> is not a number");
          checkForError(bVar3,iVar1,&local_460);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_480);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_500);
          std::__cxx11::string::~string((string *)&local_520);
          std::__cxx11::string::~string((string *)&local_540);
        }
        else {
          iVar1 = *(int *)&memberTypeIt._M_node[0xc]._M_left;
          std::operator+(&local_640,"member <",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (memberTypeIt._M_node + 4));
          std::operator+(&local_620,&local_640,"> in structure <");
          std::operator+(&local_600,&local_620,structureName);
          std::operator+(&local_5e0,&local_600,"> holds value <");
          std::operator+(&local_5c0,&local_5e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &memberTypeIt._M_node[0xb]._M_left);
          std::operator+(&local_5a0,&local_5c0,"> for an unhandled type <");
          std::operator+(&local_580,&local_5a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (memberTypeIt._M_node + 2));
          std::operator+(&local_560,&local_580,">");
          checkForError(false,iVar1,&local_560);
          std::__cxx11::string::~string((string *)&local_560);
          std::__cxx11::string::~string((string *)&local_580);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_600);
          std::__cxx11::string::~string((string *)&local_620);
          std::__cxx11::string::~string((string *)&local_640);
        }
      }
      else if (bVar2) {
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>
                 ::operator->(&local_2d8);
        bVar3 = contains(this,&(ppVar8->second).values,(string *)&memberTypeIt._M_node[0xb]._M_left)
        ;
        iVar1 = *(int *)&memberTypeIt._M_node[0xc]._M_left;
        std::operator+(&local_3e0,"value <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &memberTypeIt._M_node[0xb]._M_left);
        std::operator+(&local_3c0,&local_3e0,"> for member <");
        std::operator+(&local_3a0,&local_3c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (memberTypeIt._M_node + 4));
        std::operator+(&local_380,&local_3a0,"> in structure <");
        std::operator+(&local_360,&local_380,structureName);
        std::operator+(&local_340,&local_360,"> of enum type <");
        std::operator+(&local_320,&local_340,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (memberTypeIt._M_node + 2));
        std::operator+(&local_300,&local_320,"> not listed");
        checkForError(bVar3,iVar1,&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3e0);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(memberTypeIt._M_node + 4),"sType");
        if (bVar3) {
          pVar9 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(sTypeValues,(value_type *)&memberTypeIt._M_node[0xb]._M_left);
          local_400 = (_Base_ptr)pVar9.first._M_node;
          bVar3 = pVar9.second;
          iVar1 = *(int *)&memberTypeIt._M_node[0xc]._M_left;
          local_3f8 = bVar3;
          local_3f0 = local_400;
          local_3e8 = bVar3;
          std::operator+(&local_440,"sType value <",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &memberTypeIt._M_node[0xb]._M_left);
          std::operator+(&local_420,&local_440,"> has been used before");
          checkForError((bool)(bVar3 & 1),iVar1,&local_420);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_440);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void VulkanHppGenerator::checkStructMemberCorrectness( std::string const &             structureName,
                                                       std::vector<MemberData> const & members,
                                                       std::set<std::string> &         sTypeValues ) const
{
  // determine if this struct is requird/used
  const bool structUsed = isTypeUsed( structureName );

  for ( auto const & member : members )
  {
    // check that all member types are required in some feature or extension
    if ( member.type.type.starts_with( "Vk" ) )
    {
      auto memberTypeIt = m_types.find( member.type.type );
      assert( memberTypeIt != m_types.end() );
      checkForError( !memberTypeIt->second.requiredBy.empty(),
                     member.xmlLine,
                     "struct member type <" + member.type.type + "> used in struct <" + structureName + "> is never required for any feature or extension" );
    }

    // if a member specifies a selector, that member is a union and the selector is an enum
    // check that there's a 1-1 connection between the specified selections and the values of that enum
    if ( !member.selector.empty() )
    {
      auto selectorIt = findStructMemberIt( member.selector, members );
      assert( selectorIt != members.end() );
      auto selectorEnumIt = m_enums.find( selectorIt->type.type );
      assert( selectorEnumIt != m_enums.end() );
      auto unionIt = m_structs.find( member.type.type );
      assert( ( unionIt != m_structs.end() ) && unionIt->second.isUnion );
      for ( auto const & unionMember : unionIt->second.members )
      {
        // check that each union member has a selection, that is a value of the seleting enum
        assert( !unionMember.selection.empty() );
        for ( auto const & selection : unionMember.selection )
        {
          checkForError( contains( selectorEnumIt->second.values, selection ),
                         unionMember.xmlLine,
                         "union member <" + unionMember.name + "> uses selection <" + selection + "> that is not part of the selector type <" +
                           selectorIt->type.type + ">" );
        }
      }
    }

    // check that each member type is known
    checkForError( m_types.contains( member.type.type ), member.xmlLine, "struct member uses unknown type <" + member.type.type + ">" );

    // check that any used constant is a known constant or some potentially externally defined constant
    for ( auto const & arraySize : member.arraySizes )
    {
      if ( !isNumber( arraySize ) && !m_constants.contains( arraySize ) )
      {
        auto typeIt = m_types.find( arraySize );
        checkForError( ( typeIt != m_types.end() ) && isAllUpper( arraySize ) && ( typeIt->second.category == TypeCategory::ExternalType ),
                       member.xmlLine,
                       "struct member array size uses unknown constant <" + arraySize + ">" );
      }
    }

    // checks if a value is specified
    if ( !member.value.empty() )
    {
      auto enumIt = m_enums.find( member.type.type );
      if ( enumIt != m_enums.end() )
      {
        // check that the value exists in the specified enum (if the struct is used at all)
        if ( structUsed )
        {
          checkForError( contains( enumIt->second.values, member.value ),
                         member.xmlLine,
                         "value <" + member.value + "> for member <" + member.name + "> in structure <" + structureName + "> of enum type <" +
                           member.type.type + "> not listed" );
          // special handling for sType: no value should appear more than once
          if ( member.name == "sType" )
          {
            checkForError( sTypeValues.insert( member.value ).second, member.xmlLine, "sType value <" + member.value + "> has been used before" );
          }
        }
      }
      else if ( member.type.type == "uint32_t" )
      {
        checkForError( isNumber( member.value ),
                       member.xmlLine,
                       "value <" + member.value + "> for member <" + member.name + "> in structure <" + structureName + "> of type <" + member.type.type +
                         "> is not a number" );
      }
      else
      {
        // don't know the type of the value -> error out
        checkForError( false,
                       member.xmlLine,
                       "member <" + member.name + "> in structure <" + structureName + "> holds value <" + member.value + "> for an unhandled type <" +
                         member.type.type + ">" );
      }
    }
  }
}